

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this,ParamDict *rhs)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  long in_RSI;
  undefined8 *in_RDI;
  int type;
  int i;
  int local_58;
  ParamDictPrivate *in_stack_ffffffffffffffb0;
  
  *in_RDI = &PTR__ParamDict_02017700;
  pvVar3 = operator_new(0xe00);
  ParamDictPrivate::ParamDictPrivate(in_stack_ffffffffffffffb0);
  in_RDI[1] = pvVar3;
  for (local_58 = 0; local_58 < 0x20; local_58 = local_58 + 1) {
    iVar1 = *(int *)(*(long *)(in_RSI + 8) + (long)local_58 * 0x70);
    *(int *)(in_RDI[1] + (long)local_58 * 0x70) = iVar1;
    if (((iVar1 == 1) || (iVar1 == 2)) || (iVar1 == 3)) {
      *(undefined4 *)(in_RDI[1] + (long)local_58 * 0x70 + 4) =
           *(undefined4 *)(*(long *)(in_RSI + 8) + (long)local_58 * 0x70 + 4);
    }
    else if (iVar1 == 7) {
      std::__cxx11::string::operator=
                ((string *)(in_RDI[1] + (long)local_58 * 0x70 + 0x50),
                 (string *)(*(long *)(in_RSI + 8) + (long)local_58 * 0x70 + 0x50));
    }
    else {
      lVar4 = *(long *)(in_RSI + 8) + (long)local_58 * 0x70;
      lVar5 = in_RDI[1] + (long)local_58 * 0x70;
      puVar6 = (undefined8 *)(lVar5 + 8);
      if (puVar6 != (undefined8 *)(lVar4 + 8)) {
        if (*(long *)(lVar4 + 0x10) != 0) {
          LOCK();
          **(int **)(lVar4 + 0x10) = **(int **)(lVar4 + 0x10) + 1;
          UNLOCK();
        }
        if (*(long *)(lVar5 + 0x10) != 0) {
          piVar2 = *(int **)(lVar5 + 0x10);
          LOCK();
          iVar1 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (*(long *)(lVar5 + 0x28) == 0) {
              if ((void *)*puVar6 != (void *)0x0) {
                free((void *)*puVar6);
              }
            }
            else {
              (**(code **)(**(long **)(lVar5 + 0x28) + 0x18))(*(long **)(lVar5 + 0x28),*puVar6);
            }
          }
        }
        *puVar6 = 0;
        *(undefined8 *)(lVar5 + 0x18) = 0;
        *(undefined4 *)(lVar5 + 0x20) = 0;
        *(undefined4 *)(lVar5 + 0x30) = 0;
        *(undefined4 *)(lVar5 + 0x34) = 0;
        *(undefined4 *)(lVar5 + 0x38) = 0;
        *(undefined4 *)(lVar5 + 0x3c) = 0;
        *(undefined4 *)(lVar5 + 0x40) = 0;
        *(undefined8 *)(lVar5 + 0x48) = 0;
        *(undefined8 *)(lVar5 + 0x10) = 0;
        *puVar6 = *(undefined8 *)(lVar4 + 8);
        *(undefined8 *)(lVar5 + 0x10) = *(undefined8 *)(lVar4 + 0x10);
        *(undefined8 *)(lVar5 + 0x18) = *(undefined8 *)(lVar4 + 0x18);
        *(undefined4 *)(lVar5 + 0x20) = *(undefined4 *)(lVar4 + 0x20);
        *(undefined8 *)(lVar5 + 0x28) = *(undefined8 *)(lVar4 + 0x28);
        *(undefined4 *)(lVar5 + 0x30) = *(undefined4 *)(lVar4 + 0x30);
        *(undefined4 *)(lVar5 + 0x34) = *(undefined4 *)(lVar4 + 0x34);
        *(undefined4 *)(lVar5 + 0x38) = *(undefined4 *)(lVar4 + 0x38);
        *(undefined4 *)(lVar5 + 0x3c) = *(undefined4 *)(lVar4 + 0x3c);
        *(undefined4 *)(lVar5 + 0x40) = *(undefined4 *)(lVar4 + 0x40);
        *(undefined8 *)(lVar5 + 0x48) = *(undefined8 *)(lVar4 + 0x48);
      }
    }
  }
  return;
}

Assistant:

ParamDict::ParamDict(const ParamDict& rhs)
    : d(new ParamDictPrivate)
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        int type = rhs.d->params[i].type;
        d->params[i].type = type;
        if (type == 1 || type == 2 || type == 3)
        {
            d->params[i].i = rhs.d->params[i].i;
        }
        else if (type == 7)
        {
            d->params[i].s = rhs.d->params[i].s;
        }
        else // if (type == 4 || type == 5 || type == 6)
        {
            d->params[i].v = rhs.d->params[i].v;
        }
    }
}